

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgroup_controller.cpp
# Opt level: O0

void __thiscall CgroupController::close_enter_fd(CgroupController *this)

{
  int iVar1;
  ContextManager *pCVar2;
  string local_30;
  CgroupController *local_10;
  CgroupController *this_local;
  
  local_10 = this;
  iVar1 = close(this->enter_fd_);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Cannot close cgroups tasks file: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  this->enter_fd_ = -1;
  return;
}

Assistant:

void CgroupController::close_enter_fd() {
    if (close(enter_fd_) != 0) {
        die(format("Cannot close cgroups tasks file: %m"));
    }
    enter_fd_ = -1;
}